

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_save_layer_context(AV1_COMP *cpi)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  CYCLIC_REFRESH *pCVar4;
  int8_t *piVar5;
  int iVar6;
  int iVar7;
  LAYER_CONTEXT *__dest;
  ulong uVar8;
  uint i;
  long lVar9;
  ulong uVar10;
  
  __dest = get_layer_context(cpi);
  memcpy(__dest,&cpi->rc,0x140);
  memcpy(&__dest->p_rc,&cpi->ppi->p_rc,0x31d8);
  __dest->target_bandwidth = (long)(int)(cpi->oxcf).rc_cfg.target_bandwidth;
  __dest->group_index = cpi->gf_frame_index;
  __dest->max_mv_magnitude = (cpi->mv_search_params).max_mv_magnitude;
  iVar7 = (cpi->svc).spatial_layer_id;
  if (iVar7 == 0) {
    (cpi->svc).base_framerate = cpi->framerate;
  }
  if ((((cpi->oxcf).q_cfg.aq_mode == '\x03') && (1 < (cpi->svc).number_spatial_layers)) &&
     ((cpi->svc).temporal_layer_id == 0)) {
    pCVar4 = cpi->cyclic_refresh;
    piVar5 = __dest->map;
    __dest->map = pCVar4->map;
    pCVar4->map = piVar5;
    __dest->sb_index = pCVar4->sb_index;
    iVar6 = pCVar4->actual_num_seg2_blocks;
    __dest->actual_num_seg1_blocks = pCVar4->actual_num_seg1_blocks;
    __dest->actual_num_seg2_blocks = iVar6;
    __dest->counter_encode_maxq_scene_change = pCVar4->counter_encode_maxq_scene_change;
  }
  if (cpi->is_dropped_frame == false) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    bVar2 = (cpi->common).current_frame.frame_type;
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      if (((bVar2 & 0xfd) == 0) ||
         (((uint)(cpi->common).current_frame.refresh_frame_flags >> ((uint)lVar9 & 0x1f) & 1) != 0))
      {
        (cpi->svc).spatial_layer_fb[lVar9] = (cpi->svc).spatial_layer_id;
        (cpi->svc).temporal_layer_fb[lVar9] = (cpi->svc).temporal_layer_id;
      }
    }
    iVar7 = (cpi->svc).spatial_layer_id;
  }
  uVar3 = (cpi->svc).number_spatial_layers;
  if (iVar7 == uVar3 - 1) {
    puVar1 = &(cpi->svc).current_superframe;
    *puVar1 = *puVar1 + 1;
    uVar8 = 0;
    uVar10 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar10 = 0;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      (cpi->svc).drop_spatial_layer[uVar8] = false;
    }
  }
  return;
}

Assistant:

void av1_save_layer_context(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  const AV1_COMMON *const cm = &cpi->common;
  LAYER_CONTEXT *lc = get_layer_context(cpi);
  lc->rc = cpi->rc;
  lc->p_rc = cpi->ppi->p_rc;
  lc->target_bandwidth = (int)cpi->oxcf.rc_cfg.target_bandwidth;
  lc->group_index = cpi->gf_frame_index;
  lc->max_mv_magnitude = cpi->mv_search_params.max_mv_magnitude;
  if (svc->spatial_layer_id == 0) svc->base_framerate = cpi->framerate;
  // For spatial-svc, allow cyclic-refresh to be applied on the spatial layers,
  // for the base temporal layer.
  if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
      cpi->svc.number_spatial_layers > 1 && svc->temporal_layer_id == 0) {
    CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
    signed char *temp = lc->map;
    lc->map = cr->map;
    cr->map = temp;
    lc->sb_index = cr->sb_index;
    lc->actual_num_seg1_blocks = cr->actual_num_seg1_blocks;
    lc->actual_num_seg2_blocks = cr->actual_num_seg2_blocks;
    lc->counter_encode_maxq_scene_change = cr->counter_encode_maxq_scene_change;
  }
  if (!cpi->is_dropped_frame) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    for (unsigned int i = 0; i < REF_FRAMES; i++) {
      if (frame_is_intra_only(cm) ||
          cm->current_frame.refresh_frame_flags & (1 << i)) {
        svc->spatial_layer_fb[i] = svc->spatial_layer_id;
        svc->temporal_layer_fb[i] = svc->temporal_layer_id;
      }
    }
  }
  if (svc->spatial_layer_id == svc->number_spatial_layers - 1) {
    svc->current_superframe++;
    // Reset drop flag to false for next superframe.
    for (int sl = 0; sl < svc->number_spatial_layers; sl++)
      svc->drop_spatial_layer[sl] = false;
  }
}